

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

void adjust_cost(AV1_COMP *cpi,MACROBLOCK *x,int64_t *rd_cost)

{
  int iVar1;
  long *in_RDX;
  long in_RDI;
  int64_t var_offset;
  int64_t rec_var;
  int64_t src_var;
  int64_t *in_stack_00004000;
  int64_t *in_stack_00004008;
  int in_stack_00004014;
  MACROBLOCK *in_stack_00004018;
  AV1_COMP *in_stack_00004020;
  AV1_COMP *in_stack_ffffffffffffffd0;
  long local_28;
  long local_20;
  
  if (((*(int *)(in_RDI + 0x42350) == 3) &&
      (iVar1 = frame_is_kf_gf_arf(in_stack_ffffffffffffffd0), iVar1 == 0)) &&
     (get_variance_stats(in_stack_00004020,in_stack_00004018,in_stack_00004014,in_stack_00004008,
                         in_stack_00004000), local_28 < local_20)) {
    *in_RDX = (local_20 - local_28) * 0x80 + *in_RDX;
  }
  return;
}

Assistant:

static void adjust_cost(const AV1_COMP *cpi, const MACROBLOCK *x,
                        int64_t *rd_cost) {
  if (cpi->oxcf.algo_cfg.sharpness != 3) return;

  if (frame_is_kf_gf_arf(cpi)) return;

  int64_t src_var, rec_var;
  get_variance_stats(cpi, x, 1, &src_var, &rec_var);

  if (src_var <= rec_var) return;

  int64_t var_offset = src_var - rec_var;

  *rd_cost += RDCOST(x->rdmult, 0, var_offset);
}